

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O0

size_t __thiscall
axl::sl::StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::insert
          (StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> *this,size_t index,C *p,
          size_t length)

{
  undefined1 uVar1;
  EVP_PKEY_CTX *dst_00;
  size_t in_RCX;
  EVP_PKEY_CTX *in_RDX;
  size_t in_RDI;
  C *dst;
  Ptr<void> shadow;
  size_t oldLength;
  BufHdr *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> *in_stack_ffffffffffffff98;
  BufHdr *in_stack_ffffffffffffffa0;
  size_t local_28;
  size_t local_8;
  
  local_8 = *(size_t *)(in_RDI + 0x10);
  local_28 = in_RCX;
  if (in_RCX == 0xffffffffffffffff) {
    local_28 = StringDetailsImpl<wchar_t>::calcLength((wchar_t *)in_RDX);
  }
  if (local_28 != 0) {
    rc::Ptr<void>::Ptr((Ptr<void> *)0x133ae9);
    if ((*(long *)(in_RDI + 8) != 0) &&
       (uVar1 = rc::BufHdr::isInsideBuffer(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98),
       (bool)uVar1)) {
      rc::Ptr<void>::Ptr<axl::rc::BufHdr>
                ((Ptr<void> *)CONCAT17(uVar1,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78);
      rc::Ptr<void>::operator=
                ((Ptr<void> *)CONCAT17(uVar1,in_stack_ffffffffffffff80),
                 (Ptr<void> *)in_stack_ffffffffffffff78);
      rc::Ptr<void>::~Ptr((Ptr<void> *)0x133b4c);
    }
    dst_00 = (EVP_PKEY_CTX *)
             insertSpace(in_stack_ffffffffffffff98,
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_RDI);
    if (dst_00 == (EVP_PKEY_CTX *)0x0) {
      local_8 = 0xffffffffffffffff;
    }
    else {
      StringDetailsImpl<wchar_t>::copy(dst_00,in_RDX);
      local_8 = local_8 + local_28;
    }
    rc::Ptr<void>::~Ptr((Ptr<void> *)0x133bf4);
  }
  return local_8;
}

Assistant:

size_t
	insert(
		size_t index,
		const C* p,
		size_t length = -1
	) {
		size_t oldLength = this->m_length;

		if (length == -1)
			length = Details::calcLength(p);

		if (length == 0)
			return oldLength;

		rc::Ptr<void> shadow;
		if (this->m_hdr && this->m_hdr->isInsideBuffer(p))
			shadow = this->m_hdr; // ensure we keep p intact

		C* dst = insertSpace(index, length);
		if (!dst)
			return -1;

		Details::copy(dst, p, length);
		return oldLength + length;
	}